

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall
test_ethash_io_memo_file_size_mismatch::test_method(test_ethash_io_memo_file_size_mismatch *this)

{
  ethash_h256_t seedhash_00;
  ethash_h256_t seedhash_01;
  bool bVar1;
  ethash_io_rc eVar2;
  FILE *f;
  path local_178;
  undefined **local_158;
  ulong local_150;
  shared_count sStack_148;
  char **local_140;
  char *local_138;
  char *local_130;
  shared_count sStack_128;
  ethash_h256_t seedhash;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  ethash_get_seedhash(&seedhash,0);
  f = (FILE *)0x0;
  local_40 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x115);
  local_178.m_pathname._M_string_length._0_1_ = 0;
  local_178.m_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0013aa18;
  local_178.m_pathname.field_2._M_allocated_capacity =
       (size_type)&boost::unit_test::lazy_ostream::inst;
  local_178.m_pathname.field_2._8_8_ = (long)"\"\n" + 2;
  local_60 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_58 = "";
  local_158 = (undefined **)CONCAT44(local_158._4_4_,2);
  seedhash_00.b[8] = seedhash.b[8];
  seedhash_00.b[9] = seedhash.b[9];
  seedhash_00.b[10] = seedhash.b[10];
  seedhash_00.b[0xb] = seedhash.b[0xb];
  seedhash_00.b[0xc] = seedhash.b[0xc];
  seedhash_00.b[0xd] = seedhash.b[0xd];
  seedhash_00.b[0xe] = seedhash.b[0xe];
  seedhash_00.b[0xf] = seedhash.b[0xf];
  seedhash_00.b[0] = seedhash.b[0];
  seedhash_00.b[1] = seedhash.b[1];
  seedhash_00.b[2] = seedhash.b[2];
  seedhash_00.b[3] = seedhash.b[3];
  seedhash_00.b[4] = seedhash.b[4];
  seedhash_00.b[5] = seedhash.b[5];
  seedhash_00.b[6] = seedhash.b[6];
  seedhash_00.b[7] = seedhash.b[7];
  seedhash_00.b[0x10] = seedhash.b[0x10];
  seedhash_00.b[0x11] = seedhash.b[0x11];
  seedhash_00.b[0x12] = seedhash.b[0x12];
  seedhash_00.b[0x13] = seedhash.b[0x13];
  seedhash_00.b[0x14] = seedhash.b[0x14];
  seedhash_00.b[0x15] = seedhash.b[0x15];
  seedhash_00.b[0x16] = seedhash.b[0x16];
  seedhash_00.b[0x17] = seedhash.b[0x17];
  seedhash_00.b[0x18] = seedhash.b[0x18];
  seedhash_00.b[0x19] = seedhash.b[0x19];
  seedhash_00.b[0x1a] = seedhash.b[0x1a];
  seedhash_00.b[0x1b] = seedhash.b[0x1b];
  seedhash_00.b[0x1c] = seedhash.b[0x1c];
  seedhash_00.b[0x1d] = seedhash.b[0x1d];
  seedhash_00.b[0x1e] = seedhash.b[0x1e];
  seedhash_00.b[0x1f] = seedhash.b[0x1f];
  eVar2 = ethash_io_prepare("./test_ethash_directory/",seedhash_00,&f,0x40,false);
  local_138 = (char *)CONCAT44(local_138._4_4_,eVar2);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ethash_io_rc,ethash_io_rc>
            (&local_178,&local_60,0x115,2,2,&local_158,"ETHASH_IO_MEMO_MISMATCH",&local_138,
             "ethash_io_prepare(\"./test_ethash_directory/\", seedhash, &f, 64, false)");
  local_70 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x116);
  local_158 = (undefined **)CONCAT71(local_158._1_7_,f != (FILE *)0x0);
  local_150 = 0;
  sStack_148.pi_ = (sp_counted_base *)0x0;
  local_138 = "f";
  local_130 = "";
  local_178.m_pathname._M_string_length._0_1_ = 0;
  local_178.m_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0013b118;
  local_178.m_pathname.field_2._M_allocated_capacity =
       (size_type)&boost::unit_test::lazy_ostream::inst;
  local_90 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_88 = "";
  local_178.m_pathname.field_2._8_8_ = &local_138;
  boost::test_tools::tt_detail::report_assertion(&local_158,&local_178,&local_90,0x116,2,0,0);
  boost::detail::shared_count::~shared_count(&sStack_148);
  fclose((FILE *)f);
  local_a0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x11a);
  boost::filesystem::path::path(&local_178,"./test_ethash_directory/");
  bVar1 = boost::filesystem::is_directory(&local_178);
  local_138 = (char *)CONCAT71(local_138._1_7_,bVar1);
  local_130 = (char *)0x0;
  sStack_128.pi_ = (sp_counted_base *)0x0;
  local_140 = &local_c0;
  local_c0 = "fs::is_directory(fs::path(\"./test_ethash_directory/\"))";
  local_b8 = "";
  local_150 = local_150 & 0xffffffffffffff00;
  local_158 = &PTR__lazy_ostream_0013b118;
  sStack_148.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_d0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_c8 = "";
  boost::test_tools::tt_detail::report_assertion(&local_138,&local_158,&local_d0,0x11a,2,0,0);
  boost::detail::shared_count::~shared_count(&sStack_128);
  std::__cxx11::string::~string((string *)&local_178);
  local_e0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x11f);
  local_178.m_pathname._M_string_length._0_1_ = 0;
  local_178.m_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0013aa18;
  local_178.m_pathname.field_2._M_allocated_capacity =
       (size_type)&boost::unit_test::lazy_ostream::inst;
  local_178.m_pathname.field_2._8_8_ = (long)"\"\n" + 2;
  local_100 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_f8 = "";
  local_158 = (undefined **)CONCAT44(local_158._4_4_,1);
  seedhash_01.b[8] = seedhash.b[8];
  seedhash_01.b[9] = seedhash.b[9];
  seedhash_01.b[10] = seedhash.b[10];
  seedhash_01.b[0xb] = seedhash.b[0xb];
  seedhash_01.b[0xc] = seedhash.b[0xc];
  seedhash_01.b[0xd] = seedhash.b[0xd];
  seedhash_01.b[0xe] = seedhash.b[0xe];
  seedhash_01.b[0xf] = seedhash.b[0xf];
  seedhash_01.b[0] = seedhash.b[0];
  seedhash_01.b[1] = seedhash.b[1];
  seedhash_01.b[2] = seedhash.b[2];
  seedhash_01.b[3] = seedhash.b[3];
  seedhash_01.b[4] = seedhash.b[4];
  seedhash_01.b[5] = seedhash.b[5];
  seedhash_01.b[6] = seedhash.b[6];
  seedhash_01.b[7] = seedhash.b[7];
  seedhash_01.b[0x10] = seedhash.b[0x10];
  seedhash_01.b[0x11] = seedhash.b[0x11];
  seedhash_01.b[0x12] = seedhash.b[0x12];
  seedhash_01.b[0x13] = seedhash.b[0x13];
  seedhash_01.b[0x14] = seedhash.b[0x14];
  seedhash_01.b[0x15] = seedhash.b[0x15];
  seedhash_01.b[0x16] = seedhash.b[0x16];
  seedhash_01.b[0x17] = seedhash.b[0x17];
  seedhash_01.b[0x18] = seedhash.b[0x18];
  seedhash_01.b[0x19] = seedhash.b[0x19];
  seedhash_01.b[0x1a] = seedhash.b[0x1a];
  seedhash_01.b[0x1b] = seedhash.b[0x1b];
  seedhash_01.b[0x1c] = seedhash.b[0x1c];
  seedhash_01.b[0x1d] = seedhash.b[0x1d];
  seedhash_01.b[0x1e] = seedhash.b[0x1e];
  seedhash_01.b[0x1f] = seedhash.b[0x1f];
  eVar2 = ethash_io_prepare("./test_ethash_directory/",seedhash_01,&f,0x41,false);
  local_138 = (char *)CONCAT44(local_138._4_4_,eVar2);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ethash_io_rc,ethash_io_rc>
            (&local_178,&local_100,0x11f,2,2,&local_158,"ETHASH_IO_MEMO_SIZE_MISMATCH",&local_138,
             "ethash_io_prepare(\"./test_ethash_directory/\", seedhash, &f, 65, false)");
  boost::filesystem::path::path(&local_178,"./test_ethash_directory/");
  boost::filesystem::remove_all(&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ethash_io_memo_file_size_mismatch) {
	static const int blockn = 0;
	ethash_h256_t seedhash = ethash_get_seedhash(blockn);
	FILE *f = NULL;
	BOOST_REQUIRE_EQUAL(
		ETHASH_IO_MEMO_MISMATCH,
		ethash_io_prepare("./test_ethash_directory/", seedhash, &f, 64, false)
	);
	BOOST_REQUIRE(f);
	fclose(f);

	// let's make sure that the directory was created
	BOOST_REQUIRE(fs::is_directory(fs::path("./test_ethash_directory/")));
	// and check that we get the size mismatch detected if we request diffferent size
	BOOST_REQUIRE_EQUAL(
		ETHASH_IO_MEMO_SIZE_MISMATCH,
		ethash_io_prepare("./test_ethash_directory/", seedhash, &f, 65, false)
	);

	// cleanup
	fs::remove_all("./test_ethash_directory/");
}